

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_stop(void)

{
  uint value;
  uint new_sr;
  
  if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
  }
  else {
    value = m68ki_read_imm_16();
    m68ki_cpu.stopped = m68ki_cpu.stopped | 1;
    m68ki_set_sr(value);
    if (m68ki_remaining_cycles < (int)(uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir]) {
      m68ki_remaining_cycles =
           m68ki_remaining_cycles % (int)(uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir];
    }
    else {
      m68ki_remaining_cycles = (int)m68ki_cpu.cyc_instruction[m68ki_cpu.ir];
    }
  }
  return;
}

Assistant:

static void m68k_op_stop(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_I_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		CPU_STOPPED |= STOP_LEVEL_STOP;
		m68ki_set_sr(new_sr);
		if(m68ki_remaining_cycles >= CYC_INSTRUCTION[REG_IR])
			m68ki_remaining_cycles = CYC_INSTRUCTION[REG_IR];
		else
			USE_ALL_CYCLES();
		return;
	}
	m68ki_exception_privilege_violation();
}